

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewTextLen(xmlChar *content,int len)

{
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  xmlNodePtr cur;
  int len_local;
  xmlChar *content_local;
  
  content_local = (xmlChar *)(*xmlMalloc)(0x78);
  if ((xmlNodePtr)content_local == (xmlNodePtr)0x0) {
    content_local = (xmlChar *)0x0;
  }
  else {
    memset(content_local,0,0x78);
    ((xmlNodePtr)content_local)->type = XML_TEXT_NODE;
    ((xmlNodePtr)content_local)->name = "text";
    if (content != (xmlChar *)0x0) {
      pxVar1 = xmlStrndup(content,len);
      ((xmlNodePtr)content_local)->content = pxVar1;
      if (((xmlNodePtr)content_local)->content == (xmlChar *)0x0) {
        xmlFreeNode((xmlNodePtr)content_local);
        return (xmlNodePtr)0x0;
      }
    }
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var2 = __xmlRegisterNodeDefaultValue(), *pp_Var2 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var2 = __xmlRegisterNodeDefaultValue();
      (**pp_Var2)((xmlNodePtr)content_local);
    }
  }
  return (xmlNodePtr)content_local;
}

Assistant:

xmlNodePtr
xmlNewTextLen(const xmlChar *content, int len) {
    xmlNodePtr cur;

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_TEXT_NODE;

    cur->name = xmlStringText;
    if (content != NULL) {
	cur->content = xmlStrndup(content, len);
        if (cur->content == NULL) {
            xmlFreeNode(cur);
            return(NULL);
        }
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);
}